

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

ssize_t __thiscall r_code::SysView::write(SysView *this,int __fd,void *__buf,size_t __n)

{
  pointer pAVar1;
  pointer pAVar2;
  Atom *pAVar3;
  uint *puVar4;
  pointer puVar5;
  undefined4 in_register_00000034;
  undefined4 *puVar6;
  pointer puVar7;
  ulong i;
  
  puVar6 = (undefined4 *)CONCAT44(in_register_00000034,__fd);
  pAVar1 = (this->super_ImageObject).code.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pAVar2 = (this->super_ImageObject).code.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_start;
  *puVar6 = (int)((ulong)((long)pAVar1 - (long)pAVar2) >> 2);
  puVar5 = (this->super_ImageObject).references.m_vector.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (this->super_ImageObject).references.m_vector.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6[1] = (int)((ulong)((long)puVar7 - (long)puVar5) >> 2);
  if (pAVar1 == pAVar2) {
    i = 0;
  }
  else {
    i = 0;
    do {
      pAVar3 = vector<r_code::Atom>::operator[](&(this->super_ImageObject).code,i);
      puVar6[i + 2] = pAVar3->atom;
      i = i + 1;
    } while (i < (ulong)((long)(this->super_ImageObject).code.m_vector.
                               super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_ImageObject).code.m_vector.
                               super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2));
    puVar5 = (this->super_ImageObject).references.m_vector.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (this->super_ImageObject).references.m_vector.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (puVar7 != puVar5) {
    puVar7 = (pointer)0x0;
    do {
      puVar4 = vector<unsigned_int>::operator[]
                         (&(this->super_ImageObject).references,(size_t)puVar7);
      puVar6[(long)puVar7 + i + 2] = *puVar4;
      puVar7 = (pointer)((long)puVar7 + 1);
      puVar5 = (pointer)((long)(this->super_ImageObject).references.m_vector.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_ImageObject).references.m_vector.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2);
    } while (puVar7 < puVar5);
  }
  return (ssize_t)puVar5;
}

Assistant:

void SysView::write(uint32_t *data)
{
    data[0] = code.size();
    data[1] = references.size();
    size_t i = 0;

    for (; i < code.size(); ++i) {
        data[2 + i] = code[i].atom;
    }

    for (size_t j = 0; j < references.size(); ++j) {
        data[2 + i + j] = references[j];
    }
}